

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserFastaTest_ParseInChunks_Test::TestBody
          (BioparserFastaTest_ParseInChunks_Test *this)

{
  Parser<biosoup::Sequence> *pPVar1;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  t;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  local_40;
  
  std::__cxx11::string::string((string *)&t,"sample.fasta",(allocator *)&local_40);
  BioparserFastaTest::Setup(&this->super_BioparserFastaTest,(string *)&t);
  std::__cxx11::string::~string((string *)&t);
  pPVar1 = (this->super_BioparserFastaTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&t,pPVar1,0x10000,1);
  while( true ) {
    if (t.
        super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        t.
        super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    std::
    vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>
    ::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>*,std::vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>>>,void>
              ((vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>
                *)&(this->super_BioparserFastaTest).s,
               (this->super_BioparserFastaTest).s.
               super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>_>
                )t.
                 super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>_>
                )t.
                 super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    pPVar1 = (this->super_BioparserFastaTest).p._M_t.
             super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
             .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
    (*pPVar1->_vptr_Parser[2])(&local_40,pPVar1,0x10000,1);
    std::
    vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
    ::_M_move_assign(&t,&local_40);
    std::
    vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
    ::~vector(&local_40);
  }
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector(&t);
  BioparserFastaTest::Check(&this->super_BioparserFastaTest,true);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, ParseInChunks) {
  Setup("sample.fasta");
  for (auto t = p->Parse(65536); !t.empty(); t = p->Parse(65536)) {
    s.insert(
        s.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}